

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall duckdb::StringValueResult::RemoveLastLine(StringValueResult *this)

{
  idx_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < this->chunk_col_id; uVar1 = uVar1 + 1) {
    TemplatedValidityMask<unsigned_long>::SetValid
              (&(this->validity_mask).
                super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar1]->
                super_TemplatedValidityMask<unsigned_long>,this->number_of_rows);
  }
  this->cur_col_id = 0;
  this->chunk_col_id = 0;
  this->number_of_rows = this->number_of_rows + -1;
  return;
}

Assistant:

void StringValueResult::RemoveLastLine() {
	// potentially de-nullify values
	for (idx_t i = 0; i < chunk_col_id; i++) {
		validity_mask[i]->SetValid(static_cast<idx_t>(number_of_rows));
	}
	// reset column trackers
	cur_col_id = 0;
	chunk_col_id = 0;
	// decrement row counter
	number_of_rows--;
}